

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int i;
  ImGuiTabBar *pIVar1;
  ImVector<ImGuiTabBar> *in_RDI;
  int idx;
  undefined8 in_stack_ffffffffffffffc8;
  ImVector<ImGuiTabBar> *in_stack_ffffffffffffffd0;
  ImGuiTabBar *in_stack_ffffffffffffffe0;
  
  i = in_RDI[2].Size;
  if (i == in_RDI->Size) {
    ImVector<ImGuiTabBar>::resize
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    in_RDI[2].Size = in_RDI[2].Size + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiTabBar>::operator[](in_RDI,i);
    in_RDI[2].Size = (pIVar1->Tabs).Size;
  }
  ImVector<ImGuiTabBar>::operator[](in_RDI,i);
  operator_new(0x80);
  ImGuiTabBar::ImGuiTabBar(in_stack_ffffffffffffffe0);
  pIVar1 = ImVector<ImGuiTabBar>::operator[](in_RDI,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }